

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiekeypath.h
# Opt level: O2

bool __thiscall LOTKeyPath::propagate(LOTKeyPath *this,string *key,uint32_t depth)

{
  pointer pbVar1;
  bool bVar2;
  
  bVar2 = std::operator==(key,"__");
  if (!bVar2) {
    pbVar1 = (this->mKeys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->mKeys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= (ulong)depth)
    {
      bVar2 = std::operator==(pbVar1 + depth,"**");
      return bVar2;
    }
  }
  return true;
}

Assistant:

bool propagate(const std::string key, uint32_t depth)
    {
        return skip(key) ? true : (depth < size()) || (mKeys[depth] == "**");
    }